

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS ref_facelift_attach(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  REF_GEOM pRVar3;
  REF_CELL pRVar4;
  REF_DBL *pRVar5;
  REF_ADJ_ITEM pRVar6;
  uint uVar7;
  long lVar8;
  undefined8 uVar9;
  REF_INT RVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  REF_INT other_geom;
  REF_FACELIFT ref_facelift;
  REF_GRID freeable_ref_grid;
  REF_DBL edge_xyz [3];
  REF_DBL node_xyz [3];
  REF_INT nodes [27];
  uint local_154;
  ulong local_148;
  ulong local_140;
  double local_138;
  double local_128;
  double local_120;
  double local_118;
  int local_10c;
  long local_108;
  REF_GRID local_100;
  REF_FACELIFT local_f8;
  REF_GRID local_f0;
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  uVar7 = ref_grid_deep_copy(&local_f0,ref_grid);
  if (uVar7 == 0) {
    uVar7 = ref_facelift_create(&local_f8,local_f0,0);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1b7,"ref_facelift_attach",(ulong)uVar7,"create");
      return uVar7;
    }
    ref_grid->geom->ref_facelift = local_f8;
    local_100 = ref_grid;
    if (local_f8->displacement == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x183,"ref_facelift_initialize_edge","requires indirect facelift");
      uVar7 = 1;
    }
    else {
      pRVar3 = local_f8->grid->geom;
      if (0 < pRVar3->max) {
        lVar12 = 0;
        do {
          if (pRVar3->descr[lVar12 * 6] == 0) {
            uVar7 = ref_egads_eval(pRVar3,(REF_INT)lVar12,local_c8,(REF_DBL *)0x0);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x188,"ref_facelift_initialize_edge",(ulong)uVar7,"eval node");
              goto LAB_001eb7aa;
            }
            iVar13 = pRVar3->descr[lVar12 * 6 + 5];
            RVar10 = -1;
            uVar14 = 0xffffffff;
            if (-1 < (long)iVar13) {
              uVar14 = 0xffffffff;
              if (iVar13 < pRVar3->ref_adj->nnode) {
                uVar14 = (ulong)(uint)pRVar3->ref_adj->first[iVar13];
              }
            }
            if ((int)uVar14 != -1) {
              RVar10 = pRVar3->ref_adj->item[(int)uVar14].ref;
            }
            while ((int)uVar14 != -1) {
              if ((pRVar3->descr[RVar10 * 6] == 1) && (local_f8->strong_bc[RVar10] == 0)) {
                uVar7 = ref_egads_eval(pRVar3,RVar10,local_e8,(REF_DBL *)0x0);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x18d,"ref_facelift_initialize_edge",(ulong)uVar7,"eval face");
                  goto LAB_001eb7aa;
                }
                local_f8->strong_bc[RVar10] = 1;
                pRVar5 = local_f8->displacement;
                lVar15 = 0;
                do {
                  pRVar5[RVar10 * 3 + lVar15] = local_c8[lVar15] - local_e8[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
              }
              pRVar6 = pRVar3->ref_adj->item;
              uVar14 = (ulong)pRVar6[(int)uVar14].next;
              if (uVar14 == 0xffffffffffffffff) {
                RVar10 = -1;
              }
              else {
                RVar10 = pRVar6[uVar14].ref;
              }
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pRVar3->max);
      }
      iVar13 = 0;
      do {
        if (local_f8->displacement == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x154,"ref_facelift_solve_edge","requires indirect facelift");
          uVar14 = 1;
        }
        else {
          pRVar3 = local_f8->grid->geom;
          if (0 < pRVar3->max) {
            pRVar4 = local_f8->edg_cell;
            lVar12 = 0;
            do {
              if ((pRVar3->descr[lVar12 * 6] == 1) && (local_f8->strong_bc[lVar12] == 0)) {
                iVar1 = pRVar3->descr[lVar12 * 6 + 5];
                local_148 = 0xffffffff;
                if (-1 < (long)iVar1) {
                  local_148 = 0xffffffff;
                  if (iVar1 < pRVar4->ref_adj->nnode) {
                    local_148 = (ulong)(uint)pRVar4->ref_adj->first[iVar1];
                  }
                }
                if ((int)local_148 != -1) {
                  RVar10 = pRVar4->ref_adj->item[(int)local_148].ref;
                  local_108 = lVar12 * 0x18;
                  local_138 = 0.0;
                  local_118 = 0.0;
                  local_120 = 0.0;
                  local_128 = 0.0;
                  do {
                    local_154 = ref_cell_nodes(pRVar4,RVar10,local_a8);
                    if (local_154 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x15f,"ref_facelift_solve_edge",(ulong)local_154,"nodes");
LAB_001eb724:
                      uVar14 = (ulong)local_154;
                      goto LAB_001eb73c;
                    }
                    if (0 < pRVar4->node_per) {
                      lVar15 = 0;
                      do {
                        if (local_a8[lVar15] != iVar1) {
                          local_154 = ref_geom_find(pRVar3,local_a8[lVar15],1,
                                                    pRVar3->descr[lVar12 * 6 | 1],&local_10c);
                          if (local_154 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x164,"ref_facelift_solve_edge",(ulong)local_154,"other geom");
                            goto LAB_001eb724;
                          }
                          local_138 = local_138 + 0.5;
                          pRVar5 = local_f8->displacement;
                          lVar8 = (long)local_10c;
                          local_118 = local_118 + pRVar5[lVar8 * 3] * 0.5;
                          local_120 = local_120 + pRVar5[lVar8 * 3 + 1] * 0.5;
                          local_128 = local_128 + pRVar5[lVar8 * 3 + 2] * 0.5;
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < pRVar4->node_per);
                    }
                    if (0.1 < local_138) {
                      pRVar5 = local_f8->displacement;
                      *(double *)((long)pRVar5 + local_108) = local_118 / local_138;
                      *(double *)((long)pRVar5 + local_108 + 8) = local_120 / local_138;
                      *(double *)((long)pRVar5 + local_108 + 0x10) = local_128 / local_138;
                    }
                    pRVar6 = pRVar4->ref_adj->item;
                    iVar2 = pRVar6[(int)local_148].next;
                    local_148 = (ulong)iVar2;
                    if (local_148 == 0xffffffffffffffff) {
                      RVar10 = -1;
                    }
                    else {
                      RVar10 = pRVar6[local_148].ref;
                    }
                  } while (iVar2 != -1);
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < pRVar3->max);
          }
          uVar14 = 0;
        }
LAB_001eb73c:
        uVar7 = (uint)uVar14;
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x197,"ref_facelift_initialize_edge",uVar14,"solve");
          goto LAB_001eb7aa;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 100);
      uVar7 = 0;
    }
LAB_001eb7aa:
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1b9,"ref_facelift_attach",(ulong)uVar7,"init disp");
      return uVar7;
    }
    if (local_f8->displacement == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x133,"ref_facelift_initialize_face","requires indirect facelift");
      uVar7 = 1;
    }
    else {
      pRVar3 = local_100->geom;
      if (0 < pRVar3->max) {
        lVar12 = 0;
        do {
          if (pRVar3->descr[lVar12 * 6] == 1) {
            uVar7 = ref_egads_eval(pRVar3,(REF_INT)lVar12,local_c8,(REF_DBL *)0x0);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x138,"ref_facelift_initialize_face",(ulong)uVar7,"eval edge");
              goto LAB_001ebd8c;
            }
            iVar13 = pRVar3->descr[lVar12 * 6 + 5];
            RVar10 = -1;
            uVar14 = 0xffffffff;
            if (-1 < (long)iVar13) {
              uVar14 = 0xffffffff;
              if (iVar13 < pRVar3->ref_adj->nnode) {
                uVar14 = (ulong)(uint)pRVar3->ref_adj->first[iVar13];
              }
            }
            if ((int)uVar14 != -1) {
              RVar10 = pRVar3->ref_adj->item[(int)uVar14].ref;
            }
            while ((int)uVar14 != -1) {
              if ((pRVar3->descr[RVar10 * 6] == 2) && (local_f8->strong_bc[RVar10] == 0)) {
                uVar7 = ref_egads_eval(pRVar3,RVar10,local_e8,(REF_DBL *)0x0);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x13d,"ref_facelift_initialize_face",(ulong)uVar7,"eval face");
                  goto LAB_001ebd8c;
                }
                local_f8->strong_bc[RVar10] = 1;
                pRVar5 = local_f8->displacement;
                lVar15 = 0;
                do {
                  pRVar5[RVar10 * 3 + lVar15] = local_c8[lVar15] - local_e8[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
              }
              pRVar6 = pRVar3->ref_adj->item;
              uVar14 = (ulong)pRVar6[(int)uVar14].next;
              if (uVar14 == 0xffffffffffffffff) {
                RVar10 = -1;
              }
              else {
                RVar10 = pRVar6[uVar14].ref;
              }
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pRVar3->max);
      }
      iVar13 = 0;
      do {
        if (local_f8->displacement == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x105,"ref_facelift_solve_face","requires indirect facelift");
          uVar14 = 1;
        }
        else {
          pRVar3 = local_f8->grid->geom;
          if (0 < pRVar3->max) {
            pRVar4 = local_f8->tri_cell;
            lVar12 = 0;
            do {
              if ((pRVar3->descr[lVar12 * 6] == 2) && (local_f8->strong_bc[lVar12] == 0)) {
                iVar1 = pRVar3->descr[lVar12 * 6 + 5];
                local_140 = 0xffffffff;
                if (-1 < (long)iVar1) {
                  local_140 = 0xffffffff;
                  if (iVar1 < pRVar4->ref_adj->nnode) {
                    local_140 = (ulong)(uint)pRVar4->ref_adj->first[iVar1];
                  }
                }
                if ((int)local_140 != -1) {
                  RVar10 = pRVar4->ref_adj->item[(int)local_140].ref;
                  local_108 = lVar12 * 0x18;
                  local_138 = 0.0;
                  local_118 = 0.0;
                  local_120 = 0.0;
                  local_128 = 0.0;
                  do {
                    local_154 = ref_cell_nodes(pRVar4,RVar10,local_a8);
                    if (local_154 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x110,"ref_facelift_solve_face",(ulong)local_154,"nodes");
LAB_001ebd05:
                      uVar14 = (ulong)local_154;
                      goto LAB_001ebd20;
                    }
                    if (0 < pRVar4->node_per) {
                      lVar15 = 0;
                      do {
                        if (local_a8[lVar15] != iVar1) {
                          local_154 = ref_geom_find(pRVar3,local_a8[lVar15],2,
                                                    pRVar3->descr[lVar12 * 6 | 1],&local_10c);
                          if (local_154 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x115,"ref_facelift_solve_face",(ulong)local_154,"other geom");
                            goto LAB_001ebd05;
                          }
                          local_138 = local_138 + 0.5;
                          pRVar5 = local_f8->displacement;
                          lVar8 = (long)local_10c;
                          local_118 = local_118 + pRVar5[lVar8 * 3] * 0.5;
                          local_120 = local_120 + pRVar5[lVar8 * 3 + 1] * 0.5;
                          local_128 = local_128 + pRVar5[lVar8 * 3 + 2] * 0.5;
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < pRVar4->node_per);
                    }
                    if (0.1 < local_138) {
                      pRVar5 = local_f8->displacement;
                      *(double *)((long)pRVar5 + local_108) = local_118 / local_138;
                      *(double *)((long)pRVar5 + local_108 + 8) = local_120 / local_138;
                      *(double *)((long)pRVar5 + local_108 + 0x10) = local_128 / local_138;
                    }
                    pRVar6 = pRVar4->ref_adj->item;
                    iVar2 = pRVar6[(int)local_140].next;
                    local_140 = (ulong)iVar2;
                    if (local_140 == 0xffffffffffffffff) {
                      RVar10 = -1;
                    }
                    else {
                      RVar10 = pRVar6[local_140].ref;
                    }
                  } while (iVar2 != -1);
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < pRVar3->max);
          }
          uVar14 = 0;
        }
LAB_001ebd20:
        uVar7 = (uint)uVar14;
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x148,"ref_facelift_initialize_face",uVar14,"solve");
          goto LAB_001ebd8c;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 1000);
      uVar7 = 0;
    }
LAB_001ebd8c:
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1bb,"ref_facelift_attach",(ulong)uVar7,"init disp");
      return uVar7;
    }
    uVar7 = ref_facelift_apply(local_f8);
    if (uVar7 == 0) {
      return 0;
    }
    pcVar11 = "apply";
    uVar9 = 0x1bc;
  }
  else {
    pcVar11 = "deep copy";
    uVar9 = 0x1b5;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar9,
         "ref_facelift_attach",(ulong)uVar7,pcVar11);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_attach(REF_GRID ref_grid) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  RSS(ref_grid_deep_copy(&freeable_ref_grid, ref_grid), "deep copy");
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_initialize_edge(ref_facelift), "init disp");
  RSS(ref_facelift_initialize_face(ref_facelift, ref_grid_geom(ref_grid)),
      "init disp");
  RSS(ref_facelift_apply(ref_facelift), "apply");
  return REF_SUCCESS;
}